

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# num_parse_test.cpp
# Opt level: O3

void __thiscall
num_parse_test_serial_parse_signed_Test::~num_parse_test_serial_parse_signed_Test
          (num_parse_test_serial_parse_signed_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(num_parse_test, serial_parse_signed) {
  auto bytes = serial<int64_t, 8, big_endian_tag>("999");
  auto res = parse<int64_t, 8, big_endian_tag>(&bytes[0]);

  EXPECT_EQ(res, 999);

  bytes = serial<int64_t, 8, big_endian_tag>("-999");
  res = parse<int64_t, 8, big_endian_tag>(&bytes[0]);

  EXPECT_EQ(res, -999);
}